

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall
soplex::SPxScaler<double>::getRowMinAbsUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  DataArray<int> *this_00;
  DataArray<int> *this_01;
  int iVar1;
  SVectorBase<double> *this_02;
  double *pdVar2;
  char *pcVar3;
  element_type *this_03;
  int in_EDX;
  int __c;
  long in_RDI;
  Real RVar4;
  double a;
  double abs;
  int j;
  int exp2;
  int exp1;
  double min;
  SVectorBase<double> *rowVec;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  uint local_44;
  double local_38;
  
  this_00 = *(DataArray<int> **)(in_RDI + 0x10);
  this_01 = *(DataArray<int> **)(in_RDI + 0x18);
  this_02 = LPRowSetBase<double>::rowVector
                      ((LPRowSetBase<double> *)
                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
  pdVar2 = (double *)infinity();
  local_38 = *pdVar2;
  DataArray<int>::operator[](this_01,in_EDX);
  for (local_44 = 0; iVar1 = SVectorBase<double>::size(this_02), (int)local_44 < iVar1;
      local_44 = local_44 + 1) {
    pcVar3 = SVectorBase<double>::index(this_02,(char *)(ulong)local_44,__c);
    DataArray<int>::operator[](this_00,(int)pcVar3);
    SVectorBase<double>::value(this_02,local_44);
    RVar4 = spxLdexp((Real)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
    a = spxAbs<double>(RVar4);
    tolerances((SPxScaler<double> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    this_03 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x29ad60);
    RVar4 = Tolerances::epsilon(this_03);
    in_stack_ffffffffffffff57 = LT<double,double,double>(a,local_38,RVar4);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x29ad95);
    if ((in_stack_ffffffffffffff57 & 1) == 0) {
      a = local_38;
    }
    local_38 = a;
  }
  return local_38;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}